

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
Color::writeXml(string *__return_storage_ptr__,Color *this,int indent,string *name)

{
  int indent_00;
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  string sStack_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(&sStack_258,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a8,(string *)&sStack_258);
  poVar1 = std::operator<<(poVar1,"<");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_258);
  std::__cxx11::string::string((string *)&local_1d8,"R",(allocator *)&sStack_258);
  indent_00 = indent + 1;
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_1d8,this->r);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string((string *)&local_1f8,"G",(allocator *)&sStack_258);
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_1f8,this->g);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::string((string *)&local_218,"B",(allocator *)&sStack_258);
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_218,this->b);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string((string *)&local_238,"A",(allocator *)&sStack_258);
  Util::writeXmlElement<float>((stringstream *)local_1b8,indent_00,&local_238,this->a);
  std::__cxx11::string::~string((string *)&local_238);
  Util::getIndent_abi_cxx11_(&sStack_258,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a8,(string *)&sStack_258);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_258);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::writeXml(int indent, std::string name) const
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<" << name << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "R", r);
	Util::writeXmlElement(str, indent + 1, "G", g);
	Util::writeXmlElement(str, indent + 1, "B", b);
	Util::writeXmlElement(str, indent + 1, "A", a);

	str << Util::getIndent(indent) << "</" << name << ">" << std::endl;
	return str.str();
}